

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
          (NetDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token netType,NetStrengthSyntax *strength,Token expansionHint,DataTypeSyntax *type,
          TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  DeclaratorSyntax *pDVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  size_t index;
  
  uVar6 = netType._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = NetDeclaration;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar8 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->netType).kind = (short)uVar6;
  (this->netType).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->netType).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->netType).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->netType).info = netType.info;
  this->strength = strength;
  (this->expansionHint).kind = expansionHint.kind;
  (this->expansionHint).field_0x2 = expansionHint._2_1_;
  (this->expansionHint).numFlags = (NumericTokenFlags)expansionHint.numFlags.raw;
  (this->expansionHint).rawLen = expansionHint.rawLen;
  (this->expansionHint).info = expansionHint.info;
  (this->type).ptr = type;
  this->delay = delay;
  SVar3 = (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
       (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b380;
  sVar1 = (declarators->elements).size_;
  (this->declarators).elements.data_ = (declarators->elements).data_;
  (this->declarators).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (strength != (NetStrengthSyntax *)0x0) {
    (strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (delay != (TimingControlSyntax *)0x0) {
    (delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->declarators).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pDVar5 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::operator[]
                         (&this->declarators,index);
      (pDVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

NetDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token netType, NetStrengthSyntax* strength, Token expansionHint, DataTypeSyntax& type, TimingControlSyntax* delay, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::NetDeclaration, attributes), netType(netType), strength(strength), expansionHint(expansionHint), type(&type), delay(delay), declarators(declarators), semi(semi) {
        if (this->strength) this->strength->parent = this;
        this->type->parent = this;
        if (this->delay) this->delay->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }